

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O1

bool Assimp::Q3Shader::LoadShader(ShaderData *fill,string *pFile,IOSystem *io)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  BlendFunc BVar4;
  undefined4 extraout_var;
  Logger *pLVar6;
  long lVar7;
  ulong uVar8;
  _List_node_base *p_Var9;
  _List_node_base *p_Var10;
  byte *pbVar11;
  byte *pbVar12;
  vector<char,_std::allocator<char>_> _buff;
  string blend_src;
  _List_node_base *local_210;
  string local_200;
  long *local_1e0;
  ShaderData *local_1d8;
  vector<char,_std::allocator<char>_> local_1d0;
  _List_node_base **local_1b8;
  _List_node_base *local_1b0;
  undefined1 local_1a8 [8];
  _List_node_base *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _List_node_base *local_188;
  _List_node_base local_180;
  size_t local_170;
  ios_base local_138 [264];
  long *plVar5;
  
  local_1d8 = fill;
  local_1a8 = (undefined1  [8])&local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"rt","");
  iVar3 = (*io->_vptr_IOSystem[4])(io,(pFile->_M_dataplus)._M_p,local_1a8);
  plVar5 = (long *)CONCAT44(extraout_var,iVar3);
  if (local_1a8 != (undefined1  [8])&local_198) {
    operator_delete((void *)local_1a8,
                    CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1);
  }
  if (plVar5 != (long *)0x0) {
    pLVar6 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[28]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [28])"Loading Quake3 shader file ");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(pFile->_M_dataplus)._M_p,pFile->_M_string_length);
    std::__cxx11::stringbuf::str();
    Logger::info(pLVar6,local_200._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    lVar7 = (**(code **)(*plVar5 + 0x30))(plVar5);
    std::vector<char,_std::allocator<char>_>::vector
              (&local_1d0,lVar7 + 1,(allocator_type *)local_1a8);
    local_1e0 = plVar5;
    (**(code **)(*plVar5 + 0x10))
              (plVar5,local_1d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,lVar7,1);
    local_1d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar7] = 0;
    CommentRemover::RemoveLineComments
              ("//",local_1d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,' ');
    local_210 = (_List_node_base *)0x0;
    pbVar12 = (byte *)local_1d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
    do {
      pbVar11 = pbVar12;
      while( true ) {
        uVar8 = (ulong)*pbVar11;
        if (0x20 < uVar8) break;
        if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
          if (uVar8 == 0) goto LAB_0045d093;
          break;
        }
        pbVar11 = pbVar11 + 1;
      }
      if (*pbVar11 == 0x7b) {
        if (local_210 == (_List_node_base *)0x0) goto LAB_0045d07f;
        pbVar12 = pbVar11 + 1;
        local_1b8 = &local_210[2]._M_prev;
LAB_0045c8fb:
        while( true ) {
          bVar1 = *pbVar12;
          uVar8 = (ulong)bVar1;
          if (0x20 < uVar8) break;
          if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
            if (uVar8 != 0) break;
            goto LAB_0045d05a;
          }
          pbVar12 = pbVar12 + 1;
        }
        if (bVar1 == 0x7b) {
          local_1a0 = (_List_node_base *)0x0;
          local_198._M_local_buf[0] = '\0';
          local_188 = (_List_node_base *)0x0;
          local_180._M_next = (_List_node_base *)((ulong)local_180._M_next & 0xffffffff00000000);
          local_1a8 = (undefined1  [8])&local_198;
          p_Var9 = (_List_node_base *)operator_new(0x40);
          p_Var9[1]._M_next = p_Var9 + 2;
          if (local_1a8 == (undefined1  [8])&local_198) {
            p_Var9[2]._M_next =
                 (_List_node_base *)
                 CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]);
            p_Var9[2]._M_prev = (_List_node_base *)local_198._8_8_;
          }
          else {
            p_Var9[1]._M_next = (_List_node_base *)local_1a8;
            p_Var9[2]._M_next =
                 (_List_node_base *)
                 CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]);
          }
          p_Var9[1]._M_prev = local_1a0;
          local_1a0 = (_List_node_base *)0x0;
          local_198._M_local_buf[0] = '\0';
          *(undefined4 *)&p_Var9[3]._M_prev = local_180._M_next._0_4_;
          p_Var9[3]._M_next = local_188;
          local_1a8 = (undefined1  [8])&local_198;
          std::__detail::_List_node_base::_M_hook(p_Var9);
          local_210[3]._M_prev = (_List_node_base *)((long)&(local_210[3]._M_prev)->_M_next + 1);
          if (local_1a8 != (undefined1  [8])&local_198) {
            operator_delete((void *)local_1a8,
                            CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]
                                    ) + 1);
          }
          pbVar12 = pbVar12 + 1;
          p_Var9 = local_210[3]._M_next;
          local_1b0 = p_Var9 + 1;
          do {
            while (uVar8 = (ulong)*pbVar12, 0x20 < uVar8) {
LAB_0045cb06:
              iVar3 = strncasecmp("map",(char *)pbVar12,3);
              if (iVar3 == 0) {
                bVar2 = false;
                if (((ulong)pbVar12[3] < 0x21) &&
                   ((0x100003601U >> ((ulong)pbVar12[3] & 0x3f) & 1) != 0)) {
                  pbVar12 = pbVar12 + 4;
                  bVar2 = true;
                }
              }
              else {
                bVar2 = false;
              }
              pbVar11 = pbVar12;
              if (bVar2) {
LAB_0045cb7a:
                while ((pbVar12 = pbVar11, (ulong)*pbVar11 < 0x21 &&
                       ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) != 0))) {
                  pbVar11 = pbVar11 + 1;
                }
                while ((0x20 < (ulong)*pbVar12 ||
                       ((0x100003601U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0))) {
                  pbVar12 = pbVar12 + 1;
                }
                local_1a8 = (undefined1  [8])&local_198;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pbVar11,pbVar12)
                ;
                std::__cxx11::string::operator=((string *)local_1b0,(string *)local_1a8);
                if (local_1a8 != (undefined1  [8])&local_198) {
                  operator_delete((void *)local_1a8,
                                  CONCAT71(local_198._M_allocated_capacity._1_7_,
                                           local_198._M_local_buf[0]) + 1);
                }
              }
              else {
                iVar3 = strncasecmp("clampmap",(char *)pbVar12,8);
                if (iVar3 == 0) {
                  bVar2 = false;
                  if (((ulong)pbVar12[8] < 0x21) &&
                     ((0x100003601U >> ((ulong)pbVar12[8] & 0x3f) & 1) != 0)) {
                    pbVar12 = pbVar12 + 9;
                    bVar2 = true;
                  }
                }
                else {
                  bVar2 = false;
                }
                pbVar11 = pbVar12;
                if (bVar2) goto LAB_0045cb7a;
                iVar3 = strncasecmp("blendfunc",(char *)pbVar12,9);
                if (iVar3 == 0) {
                  bVar2 = false;
                  if (((ulong)pbVar12[9] < 0x21) &&
                     ((0x100003601U >> ((ulong)pbVar12[9] & 0x3f) & 1) != 0)) {
                    pbVar12 = pbVar12 + 10;
                    bVar2 = true;
                  }
                }
                else {
                  bVar2 = false;
                }
                if (bVar2) {
                  while ((pbVar11 = pbVar12, (ulong)*pbVar12 < 0x21 &&
                         ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0))) {
                    pbVar12 = pbVar12 + 1;
                  }
                  while ((0x20 < (ulong)*pbVar11 ||
                         ((0x100003601U >> ((ulong)*pbVar11 & 0x3f) & 1) == 0))) {
                    pbVar11 = pbVar11 + 1;
                  }
                  local_1a8 = (undefined1  [8])&local_198;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1a8,pbVar12,pbVar11);
                  iVar3 = std::__cxx11::string::compare((char *)local_1a8);
                  if (iVar3 == 0) {
                    p_Var10 = (_List_node_base *)0x100000001;
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare((char *)local_1a8);
                    if (iVar3 == 0) {
                      p_Var10 = (_List_node_base *)0x200000003;
                    }
                    else {
                      iVar3 = std::__cxx11::string::compare((char *)local_1a8);
                      if (iVar3 != 0) {
                        BVar4 = StringToBlendFunc((string *)local_1a8);
                        *(BlendFunc *)&p_Var9[3]._M_next = BVar4;
                        while ((pbVar12 = pbVar11, (ulong)*pbVar11 < 0x21 &&
                               ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) != 0))) {
                          pbVar11 = pbVar11 + 1;
                        }
                        while ((0x20 < (ulong)*pbVar12 ||
                               ((0x100003601U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0))) {
                          pbVar12 = pbVar12 + 1;
                        }
                        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_200,pbVar11,pbVar12);
                        BVar4 = StringToBlendFunc(&local_200);
                        *(BlendFunc *)((long)&p_Var9[3]._M_next + 4) = BVar4;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_200._M_dataplus._M_p != &local_200.field_2) {
                          operator_delete(local_200._M_dataplus._M_p,
                                          local_200.field_2._M_allocated_capacity + 1);
                        }
                        goto LAB_0045ceb2;
                      }
                      p_Var10 = (_List_node_base *)0x600000005;
                    }
                  }
                  p_Var9[3]._M_next = p_Var10;
                  pbVar12 = pbVar11;
LAB_0045ceb2:
                  if (local_1a8 != (undefined1  [8])&local_198) {
                    operator_delete((void *)local_1a8,
                                    CONCAT71(local_198._M_allocated_capacity._1_7_,
                                             local_198._M_local_buf[0]) + 1);
                  }
                }
                else {
                  iVar3 = strncasecmp("alphafunc",(char *)pbVar12,9);
                  if (iVar3 == 0) {
                    bVar2 = false;
                    if (((ulong)pbVar12[9] < 0x21) &&
                       ((0x100003601U >> ((ulong)pbVar12[9] & 0x3f) & 1) != 0)) {
                      pbVar12 = pbVar12 + 10;
                      bVar2 = true;
                    }
                  }
                  else {
                    bVar2 = false;
                  }
                  if (bVar2) {
                    while ((pbVar11 = pbVar12, (ulong)*pbVar12 < 0x21 &&
                           ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0))) {
                      pbVar12 = pbVar12 + 1;
                    }
                    while ((0x20 < (ulong)*pbVar11 ||
                           ((0x100003601U >> ((ulong)*pbVar11 & 0x3f) & 1) == 0))) {
                      pbVar11 = pbVar11 + 1;
                    }
                    local_1a8 = (undefined1  [8])&local_198;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1a8,pbVar12,pbVar11);
                    iVar3 = std::__cxx11::string::compare((char *)local_1a8);
                    pbVar12 = pbVar11;
                    if (iVar3 == 0) {
                      *(undefined4 *)&p_Var9[3]._M_prev = 1;
                    }
                    else {
                      iVar3 = std::__cxx11::string::compare((char *)local_1a8);
                      if (iVar3 == 0) {
                        *(undefined4 *)&p_Var9[3]._M_prev = 2;
                      }
                      else {
                        iVar3 = std::__cxx11::string::compare((char *)local_1a8);
                        if (iVar3 == 0) {
                          *(undefined4 *)&p_Var9[3]._M_prev = 3;
                        }
                      }
                    }
                    goto LAB_0045ceb2;
                  }
                  if (*pbVar12 == 0x7d) goto LAB_0045cf15;
                }
              }
              while ((0xd < *pbVar12 || ((0x2401U >> (*pbVar12 & 0x1f) & 1) == 0))) {
                pbVar12 = pbVar12 + 1;
              }
              for (; (*pbVar12 == 0xd || (*pbVar12 == 10)); pbVar12 = pbVar12 + 1) {
              }
            }
            if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
              if (uVar8 != 0) goto LAB_0045cb06;
              goto LAB_0045cf18;
            }
            pbVar12 = pbVar12 + 1;
          } while( true );
        }
        if (bVar1 != 0x7d) {
          iVar3 = strncasecmp("cull",(char *)pbVar12,4);
          if (iVar3 == 0) {
            bVar2 = false;
            if (((ulong)pbVar12[4] < 0x21) &&
               ((0x100003601U >> ((ulong)pbVar12[4] & 0x3f) & 1) != 0)) {
              pbVar12 = pbVar12 + 5;
              bVar2 = true;
            }
          }
          else {
            bVar2 = false;
          }
          if (bVar2) {
            for (; (*pbVar12 == 0x20 || (*pbVar12 == 9)); pbVar12 = pbVar12 + 1) {
            }
            iVar3 = strncasecmp((char *)pbVar12,"back",4);
            if (iVar3 == 0) {
              *(undefined4 *)&local_210[2]._M_next = 2;
            }
            else {
              iVar3 = strncasecmp((char *)pbVar12,"front",5);
              if (iVar3 == 0) {
                *(undefined4 *)&local_210[2]._M_next = 1;
              }
              else {
                iVar3 = strncasecmp((char *)pbVar12,"none",4);
                if ((iVar3 == 0) || (iVar3 = strncasecmp((char *)pbVar12,"disable",7), iVar3 == 0))
                {
                  *(undefined4 *)&local_210[2]._M_next = 0;
                }
                else {
                  pLVar6 = DefaultLogger::get();
                  Logger::error(pLVar6,"Q3Shader: Unrecognized cull mode");
                }
              }
            }
          }
LAB_0045cf18:
          while ((0xd < *pbVar12 || ((0x2401U >> (*pbVar12 & 0x1f) & 1) == 0))) {
LAB_0045cf15:
            pbVar12 = pbVar12 + 1;
          }
          for (; (*pbVar12 == 0xd || (*pbVar12 == 10)); pbVar12 = pbVar12 + 1) {
          }
          goto LAB_0045c8fb;
        }
        pbVar12 = pbVar12 + 1;
        local_210 = (_List_node_base *)0x0;
      }
      else {
        local_1a0 = (_List_node_base *)0x0;
        local_198._M_local_buf[0] = '\0';
        local_188 = (_List_node_base *)CONCAT44(local_188._4_4_,1);
        local_170 = 0;
        local_1a8 = (undefined1  [8])&local_198;
        local_180._M_next = &local_180;
        local_180._M_prev = &local_180;
        std::__cxx11::
        list<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
        ::_M_insert<Assimp::Q3Shader::ShaderDataBlock>
                  (&local_1d8->blocks,(iterator)local_1d8,(ShaderDataBlock *)local_1a8);
        std::__cxx11::
        _List_base<Assimp::Q3Shader::ShaderMapBlock,_std::allocator<Assimp::Q3Shader::ShaderMapBlock>_>
        ::_M_clear((_List_base<Assimp::Q3Shader::ShaderMapBlock,_std::allocator<Assimp::Q3Shader::ShaderMapBlock>_>
                    *)&local_180);
        if (local_1a8 != (undefined1  [8])&local_198) {
          operator_delete((void *)local_1a8,
                          CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0])
                          + 1);
        }
        while (((ulong)*pbVar11 < 0x21 && ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) != 0))) {
          pbVar11 = pbVar11 + 1;
        }
        local_210 = (local_1d8->blocks).
                    super__List_base<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                    ._M_impl._M_node.super__List_node_base._M_prev + 1;
        pbVar12 = pbVar11;
        while ((0x20 < (ulong)*pbVar12 || ((0x100003601U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0))) {
          pbVar12 = pbVar12 + 1;
        }
        local_1a8 = (undefined1  [8])&local_198;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pbVar11,pbVar12);
        std::__cxx11::string::operator=((string *)local_210,(string *)local_1a8);
        if (local_1a8 != (undefined1  [8])&local_198) {
          operator_delete((void *)local_1a8,
                          CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0])
                          + 1);
        }
      }
LAB_0045d05a:
      while ((0xd < *pbVar12 || ((0x2401U >> (*pbVar12 & 0x1f) & 1) == 0))) {
        pbVar12 = pbVar12 + 1;
      }
      for (; (*pbVar12 == 0xd || (*pbVar12 == 10)); pbVar12 = pbVar12 + 1) {
      }
    } while( true );
  }
LAB_0045d0af:
  if (plVar5 != (long *)0x0) {
    (**(code **)(*plVar5 + 8))(plVar5);
  }
  return plVar5 != (long *)0x0;
LAB_0045d07f:
  pLVar6 = DefaultLogger::get();
  Logger::error(pLVar6,"Q3Shader: Unexpected shader section token \'{\'");
LAB_0045d093:
  plVar5 = local_1e0;
  if ((byte *)local_1d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (byte *)0x0) {
    operator_delete(local_1d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    plVar5 = local_1e0;
  }
  goto LAB_0045d0af;
}

Assistant:

bool Q3Shader::LoadShader(ShaderData& fill, const std::string& pFile,IOSystem* io)
{
    std::unique_ptr<IOStream> file( io->Open( pFile, "rt"));
    if (!file.get())
        return false; // if we can't access the file, don't worry and return

    ASSIMP_LOG_INFO_F("Loading Quake3 shader file ", pFile);

    // read file in memory
    const size_t s = file->FileSize();
    std::vector<char> _buff(s+1);
    file->Read(&_buff[0],s,1);
    _buff[s] = 0;

    // remove comments from it (C++ style)
    CommentRemover::RemoveLineComments("//",&_buff[0]);
    const char* buff = &_buff[0];

    Q3Shader::ShaderDataBlock* curData = NULL;
    Q3Shader::ShaderMapBlock*  curMap  = NULL;

    // read line per line
    for (;SkipSpacesAndLineEnd(&buff);SkipLine(&buff)) {

        if (*buff == '{') {
            ++buff;

            // append to last section, if any
            if (!curData) {
                ASSIMP_LOG_ERROR("Q3Shader: Unexpected shader section token \'{\'");
                return true; // still no failure, the file is there
            }

            // read this data section
            for (;SkipSpacesAndLineEnd(&buff);SkipLine(&buff)) {
                if (*buff == '{') {
                    ++buff;
                    // add new map section
                    curData->maps.push_back(Q3Shader::ShaderMapBlock());
                    curMap = &curData->maps.back();

                    for (;SkipSpacesAndLineEnd(&buff);SkipLine(&buff)) {
                        // 'map' - Specifies texture file name
                        if (TokenMatchI(buff,"map",3) || TokenMatchI(buff,"clampmap",8)) {
                            curMap->name = GetNextToken(buff);
                        }
                        // 'blendfunc' - Alpha blending mode
                        else if (TokenMatchI(buff,"blendfunc",9)) {
                            const std::string blend_src = GetNextToken(buff);
                            if (blend_src == "add") {
                                curMap->blend_src  = Q3Shader::BLEND_GL_ONE;
                                curMap->blend_dest = Q3Shader::BLEND_GL_ONE;
                            }
                            else if (blend_src == "filter") {
                                curMap->blend_src  = Q3Shader::BLEND_GL_DST_COLOR;
                                curMap->blend_dest = Q3Shader::BLEND_GL_ZERO;
                            }
                            else if (blend_src == "blend") {
                                curMap->blend_src  = Q3Shader::BLEND_GL_SRC_ALPHA;
                                curMap->blend_dest = Q3Shader::BLEND_GL_ONE_MINUS_SRC_ALPHA;
                            }
                            else {
                                curMap->blend_src  = StringToBlendFunc(blend_src);
                                curMap->blend_dest = StringToBlendFunc(GetNextToken(buff));
                            }
                        }
                        // 'alphafunc' - Alpha testing mode
                        else if (TokenMatchI(buff,"alphafunc",9)) {
                            const std::string at = GetNextToken(buff);
                            if (at == "GT0") {
                                curMap->alpha_test = Q3Shader::AT_GT0;
                            }
                            else if (at == "LT128") {
                                curMap->alpha_test = Q3Shader::AT_LT128;
                            }
                            else if (at == "GE128") {
                                curMap->alpha_test = Q3Shader::AT_GE128;
                            }
                        }
                        else if (*buff == '}') {
                            ++buff;
                            // close this map section
                            curMap = NULL;
                            break;
                        }
                    }

                }
                else if (*buff == '}') {
                    ++buff;
                    curData = NULL;
                    break;
                }

                // 'cull' specifies culling behaviour for the model
                else if (TokenMatchI(buff,"cull",4)) {
                    SkipSpaces(&buff);
                    if (!ASSIMP_strincmp(buff,"back",4)) {
                        curData->cull = Q3Shader::CULL_CCW;
                    } else if (!ASSIMP_strincmp(buff,"front",5)) {
                        curData->cull = Q3Shader::CULL_CW;
                    } else if (!ASSIMP_strincmp(buff,"none",4) || !ASSIMP_strincmp(buff,"disable",7)) {
                        curData->cull = Q3Shader::CULL_NONE;
                    } else {
                        ASSIMP_LOG_ERROR("Q3Shader: Unrecognized cull mode");
                    }
                }
            }
        } else {
            // add new section
            fill.blocks.push_back(Q3Shader::ShaderDataBlock());
            curData = &fill.blocks.back();

            // get the name of this section
            curData->name = GetNextToken(buff);
        }
    }
    return true;
}